

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O3

void __thiscall
nigel::IMC_Generator::generateMoveA
          (IMC_Generator *this,OperationType ot,shared_ptr<nigel::IM_Operator> *op)

{
  int iVar1;
  shared_ptr<nigel::IM_Operator> *rOp;
  shared_ptr<nigel::IM_Operator> *lOp;
  HexOp operation;
  shared_ptr<nigel::IM_Operator> local_e8;
  shared_ptr<nigel::IM_Operator> local_d8;
  shared_ptr<nigel::IM_Operator> local_c8;
  shared_ptr<nigel::IM_Operator> local_b8;
  IM_Operator local_a8;
  shared_ptr<nigel::IM_Operator> local_88;
  shared_ptr<nigel::IM_Operator> local_78;
  shared_ptr<nigel::IM_Operator> local_68;
  shared_ptr<nigel::IM_Operator> local_58;
  shared_ptr<nigel::IM_Operator> local_48;
  shared_ptr<nigel::IM_Operator> local_38;
  
  if (ot == c) {
    local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_a8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a8.type = constant;
    local_a8._28_4_ = 0;
    addCmd(this,mov_a_const,&local_e8,
           (shared_ptr<nigel::IM_Operator> *)
           &local_a8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
            super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      return;
    }
  }
  else if (ot == v) {
    IM_Operator::as<nigel::IM_Variable>(&local_a8);
    iVar1 = *(int *)((long)local_a8._vptr_IM_Operator + 0x1c);
    if (local_a8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
        super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_a8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                 super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (iVar1 == 0) {
      local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if (local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_38.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_38.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_a_adr,&local_b8,&local_38);
      if (local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    else {
      IM_Operator::as<nigel::IM_Variable>(&local_a8);
      iVar1 = *(int *)((long)local_a8._vptr_IM_Operator + 0x1c);
      if (local_a8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
          super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                   super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (iVar1 == 1) {
        local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                ._M_pi;
        if (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_48.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_48.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,&local_c8,&local_48);
        if (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        lOp = &local_58;
        local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_58.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        rOp = &local_68;
        local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_68.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        operation = movx_a_dptr;
      }
      else {
        IM_Operator::as<nigel::IM_Variable>(&local_a8);
        iVar1 = *(int *)((long)local_a8._vptr_IM_Operator + 0x1c);
        if (local_a8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
            super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_a8.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                     super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        if ((iVar1 != 4) && (iVar1 != 2)) {
          return;
        }
        local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
                ._M_pi;
        if (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi)->_M_use_count =
                 (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        generateLoadStackR0(this,&local_d8);
        if (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        lOp = &local_78;
        local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_78.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        rOp = &local_88;
        local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_88.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        operation = mov_a_atr0;
      }
      addCmd(this,operation,lOp,rOp);
    }
  }
  return;
}

Assistant:

void IMC_Generator::generateMoveA( OperationType ot, std::shared_ptr<IM_Operator> op )
	{
		if( ot == OT::v )
		{
			if( op->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_adr, op );
			}
			else if( op->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, op );
				addCmd( HexOp::movx_a_dptr );
			}
			else if( op->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( op );
				addCmd( HexOp::mov_a_atr0 );
			}
		}
		else if( ot == OT::c )
		{
			addCmd( HexOp::mov_a_const, op );
		}
		//Ignore OT::t because it is already correct.
	}